

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::UpdateBean::
act<hiberlite::AVisitor<hiberlite::UpdateBean>,double,hiberlite::stl_stream_adapter<double,std::set<double,std::less<double>,std::allocator<double>>>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av,
          collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
          *nvp)

{
  int *piVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  sqlid_t rowid;
  RowScope *pRVar4;
  long index;
  _Self __tmp;
  _Base_ptr p_Var5;
  string tab;
  sql_nvp<double> el_nvp;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  shared_connection local_188;
  shared_connection local_178;
  undefined1 local_168 [32];
  double *local_148;
  _Alloc_hider local_140;
  double local_138;
  char local_130 [16];
  double *local_120;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [40];
  _Alloc_hider local_70;
  char local_60 [16];
  string local_50;
  
  pcVar2 = (nvp->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (nvp->name)._M_string_length);
  AVisitor<hiberlite::UpdateBean>::diveTable(av,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_168._0_8_ = local_168 + 0x10;
  pcVar2 = (av->scope)._table._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_168,pcVar2,pcVar2 + (av->scope)._table._M_string_length);
  pcVar2 = (av->scope)._prefix._M_dataplus._M_p;
  local_148 = &local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar2,pcVar2 + (av->scope)._prefix._M_string_length);
  local_130._8_4_ = (av->scope).prefix_depth;
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_168._0_8_,(pointer)(local_168._0_8_ + local_168._8_8_));
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_);
  }
  p_Var5 = (nvp->stream).it._M_node;
  if ((_Rb_tree_header *)p_Var5 != &(((nvp->stream).ct)->_M_t)._M_impl.super__Rb_tree_header) {
    local_120 = &(nvp->stream).xx;
    index = 0;
    do {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      (nvp->stream).it._M_node = p_Var3;
      (nvp->stream).xx = *(double *)(p_Var5 + 1);
      local_178._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      local_178.res = (av->rootKey).con.res;
      if (local_178.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_178.res)->refCount = (local_178.res)->refCount + 1;
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_1a8,local_1a8 + local_1a0)
      ;
      rowid = Database::allocId(&local_178,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      local_178._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      if (local_178.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_178.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_178.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_1a8,local_1a8 + local_1a0)
      ;
      pRVar4 = curRow(this);
      startRow(this,&local_f8,rowid,pRVar4->id,index);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"item","");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      sql_nvp<double>::sql_nvp((sql_nvp<double> *)local_168,&local_118,local_120,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_168._0_8_,(pointer)(local_168._0_8_ + local_168._8_8_));
      local_98._32_8_ = local_148;
      local_70._M_p = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_140._M_p,local_140._M_p + (long)local_138);
      AVisitor<hiberlite::UpdateBean>::operator&(av,(sql_nvp<double> *)local_98);
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
      local_188._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      local_188.res = (av->rootKey).con.res;
      if (local_188.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_188.res)->refCount = (local_188.res)->refCount + 1;
      }
      commitRow(this,&local_188,rowid);
      local_188._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      if (local_188.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_188.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_188.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      if (local_140._M_p != local_130) {
        operator_delete(local_140._M_p);
      }
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_);
      }
      p_Var5 = (nvp->stream).it._M_node;
      index = index + 1;
    } while ((_Rb_tree_header *)p_Var5 != &(((nvp->stream).ct)->_M_t)._M_impl.super__Rb_tree_header)
    ;
  }
  AVisitor<hiberlite::UpdateBean>::popScope(av);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  return;
}

Assistant:

void UpdateBean::act(AV& av, collection_nvp<E,S> nvp ){

	sqlid_t index=0;
	S& stream=nvp.stream;

	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		while(!stream.done()){
			E& el=stream.getNext();
				sqlid_t entry_id=Database::allocId(av.getConnection(), tab);

				startRow(tab,entry_id, curRow()->id,index);
					sql_nvp<E> el_nvp("item",el);
					av & el_nvp;
				commitRow(av.getConnection(), entry_id);
			index++;
		}
	av.pop();
}